

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChooseGenerator.cpp
# Opt level: O1

void __thiscall AxA_isGreaterThan_A::AxA_isGreaterThan_A(AxA_isGreaterThan_A *this)

{
  long *plVar1;
  pointer *__ptr;
  Generator<int> local_28;
  
  plVar1 = (long *)operator_new(0x10);
  *plVar1 = (long)&PTR__GenConcept_0010ac90;
  plVar1[1] = 0x3e800000002;
  local_28.m_gen._M_t.
  super___uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
  .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>._M_head_impl =
       (unique_ptr<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
        )operator_new(0x10);
  *(undefined ***)
   local_28.m_gen._M_t.
   super___uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
   .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>._M_head_impl =
       &PTR__GenConcept_0010ac90;
  *(long *)((long)local_28.m_gen._M_t.
                  super___uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
                  .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>._M_head_impl + 8)
       = 0x3e800000002;
  (this->
  super_Property<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  ).super_PropertyBase._vptr_PropertyBase = (_func_int **)&PTR_expect_0010ad08;
  cppqc::tupleOf<int>((cppqc *)&(this->
                                super_Property<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
                                ).m_gen,&local_28);
  if (local_28.m_gen._M_t.
      super___uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
      .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>._M_head_impl !=
      (__uniq_ptr_data<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_28.m_gen._M_t.
                          super___uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
                          .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>.
                          _M_head_impl + 8))();
  }
  local_28.m_gen._M_t.
  super___uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
  .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>._M_head_impl =
       (unique_ptr<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
        )(__uniq_ptr_data<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>,_true,_true>
          )0x0;
  (**(code **)(*plVar1 + 8))(plVar1);
  (this->
  super_Property<int,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
  ).super_PropertyBase._vptr_PropertyBase = (_func_int **)&PTR_expect_0010ac08;
  return;
}

Assistant:

AxA_isGreaterThan_A() : Property(cppqc::choose(MIN, MAX)) {}